

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::Recycled(Recycled<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *this)

{
  Stack<std::unique_ptr<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>_>
  *pSVar1;
  
  pSVar1 = mem();
  if (pSVar1->_cursor != pSVar1->_stack) {
    mem();
    Stack<std::unique_ptr<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>_>
    ::pop((Stack<std::unique_ptr<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>_>
           *)this);
    return;
  }
  std::
  make_unique<Lib::Map<unsigned_int,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket,Lib::DefaultHash>>
            ();
  return;
}

Assistant:

Recycled()
    : _self(mem().isNonEmpty() ? mem().pop() : IF_USE_PTRS(std::make_unique<T>(), T()))
  { }